

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_decoded_utf8_stats *
rf_count_utf8_chars(rf_decoded_utf8_stats *__return_storage_ptr__,char *text,rf_int len)

{
  long local_48;
  undefined1 local_30 [8];
  rf_decoded_rune decoded_rune;
  rf_int len_local;
  char *text_local;
  
  decoded_rune._16_8_ = len;
  memset(__return_storage_ptr__,0,0x20);
  if ((text != (char *)0x0) && (len_local = (rf_int)text, 0 < (long)decoded_rune._16_8_)) {
    while (0 < (long)decoded_rune._16_8_) {
      rf_decode_utf8_char((rf_decoded_rune *)local_30,(char *)len_local,decoded_rune._16_8_);
      len_local = decoded_rune._0_8_ + len_local;
      decoded_rune._16_8_ = decoded_rune._16_8_ - decoded_rune._0_8_;
      __return_storage_ptr__->bytes_processed =
           decoded_rune._0_8_ + __return_storage_ptr__->bytes_processed;
      if (((byte)decoded_rune.bytes_processed & 1) == 0) {
        local_48 = decoded_rune._0_8_;
      }
      else {
        local_48 = 0;
      }
      __return_storage_ptr__->invalid_bytes = local_48 + __return_storage_ptr__->invalid_bytes;
      __return_storage_ptr__->valid_rune_count =
           (long)(int)(uint)(((byte)decoded_rune.bytes_processed & 1) != 0) +
           __return_storage_ptr__->valid_rune_count;
      __return_storage_ptr__->total_rune_count = __return_storage_ptr__->total_rune_count + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_decoded_utf8_stats rf_count_utf8_chars(const char* text, rf_int len)
{
    rf_decoded_utf8_stats result = {0};

    if (text && len > 0)
    {
        while (len > 0)
        {
            rf_decoded_rune decoded_rune = rf_decode_utf8_char(text, len);

            text += decoded_rune.bytes_processed;
            len  -= decoded_rune.bytes_processed;

            result.bytes_processed  += decoded_rune.bytes_processed;
            result.invalid_bytes    += decoded_rune.valid ? 0 : decoded_rune.bytes_processed;
            result.valid_rune_count += decoded_rune.valid ? 1 : 0;
            result.total_rune_count += 1;
        }
    }

    return result;
}